

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Builtins.h
# Opt level: O3

void __thiscall
slang::ast::builtins::Builtins::addSystemMethod
          (Builtins *this,SymbolKind typeKind,shared_ptr<slang::ast::SystemSubroutine> *method)

{
  size_t *psVar1;
  group_type_pointer pgVar2;
  element_type *peVar3;
  group_type_pointer pgVar4;
  value_type_pointer ppVar5;
  ulong uVar6;
  uint uVar7;
  undefined1 auVar8 [16];
  bool bVar9;
  byte bVar10;
  uint uVar11;
  ulong uVar12;
  long lVar13;
  ulong uVar14;
  ulong uVar15;
  ulong pos0;
  ulong hash;
  undefined1 auVar16 [16];
  uchar uVar17;
  uchar uVar18;
  uchar uVar19;
  byte bVar20;
  uchar uVar21;
  uchar uVar22;
  uchar uVar23;
  byte bVar24;
  uchar uVar25;
  uchar uVar26;
  uchar uVar27;
  byte bVar28;
  uchar uVar29;
  uchar uVar30;
  uchar uVar31;
  byte bVar32;
  try_emplace_args_t local_b1;
  table_core<boost::unordered::detail::foa::flat_map_types<std::tuple<std::basic_string_view<char,std::char_traits<char>>,slang::ast::SymbolKind>,std::shared_ptr<slang::ast::SystemSubroutine>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::tuple<std::basic_string_view<char,std::char_traits<char>>,slang::ast::SymbolKind>,void>,std::equal_to<std::tuple<std::basic_string_view<char,std::char_traits<char>>,slang::ast::SymbolKind>>,std::allocator<std::pair<std::tuple<std::basic_string_view<char,std::char_traits<char>>,slang::ast::SymbolKind>const,std::shared_ptr<slang::ast::SystemSubroutine>>>>
  *local_b0;
  shared_ptr<slang::ast::SystemSubroutine> *local_a8;
  ulong local_a0;
  ulong local_98;
  ulong local_90;
  ulong local_88;
  tuple<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::SymbolKind> local_80;
  uchar local_68;
  uchar uStack_67;
  uchar uStack_66;
  byte bStack_65;
  uchar uStack_64;
  uchar uStack_63;
  uchar uStack_62;
  byte bStack_61;
  uchar uStack_60;
  uchar uStack_5f;
  uchar uStack_5e;
  byte bStack_5d;
  uchar uStack_5c;
  uchar uStack_5b;
  uchar uStack_5a;
  byte bStack_59;
  uchar local_58;
  uchar uStack_57;
  uchar uStack_56;
  byte bStack_55;
  uchar uStack_54;
  uchar uStack_53;
  uchar uStack_52;
  byte bStack_51;
  uchar uStack_50;
  uchar uStack_4f;
  uchar uStack_4e;
  byte bStack_4d;
  uchar uStack_4c;
  uchar uStack_4b;
  uchar uStack_4a;
  byte bStack_49;
  size_t seed;
  
  local_b0 = (table_core<boost::unordered::detail::foa::flat_map_types<std::tuple<std::basic_string_view<char,std::char_traits<char>>,slang::ast::SymbolKind>,std::shared_ptr<slang::ast::SystemSubroutine>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::tuple<std::basic_string_view<char,std::char_traits<char>>,slang::ast::SymbolKind>,void>,std::equal_to<std::tuple<std::basic_string_view<char,std::char_traits<char>>,slang::ast::SymbolKind>>,std::allocator<std::pair<std::tuple<std::basic_string_view<char,std::char_traits<char>>,slang::ast::SymbolKind>const,std::shared_ptr<slang::ast::SystemSubroutine>>>>
              *)&this->methodMap;
  peVar3 = (method->super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>).
           _M_ptr;
  local_80.
  super__Tuple_impl<0UL,_std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::SymbolKind>
  .super__Head_base<0UL,_std::basic_string_view<char,_std::char_traits<char>_>,_false>._M_head_impl.
  _M_str = (peVar3->name)._M_dataplus._M_p;
  local_80.
  super__Tuple_impl<0UL,_std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::SymbolKind>
  .super__Head_base<0UL,_std::basic_string_view<char,_std::char_traits<char>_>,_false>._M_head_impl.
  _M_len = (peVar3->name)._M_string_length;
  seed = 0;
  local_a8 = method;
  local_80.
  super__Tuple_impl<0UL,_std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::SymbolKind>
  .super__Tuple_impl<1UL,_slang::ast::SymbolKind>.
  super__Head_base<1UL,_slang::ast::SymbolKind,_false>._M_head_impl =
       (_Head_base<1UL,_slang::ast::SymbolKind,_false>)
       (_Head_base<1UL,_slang::ast::SymbolKind,_false>)typeKind;
  slang::detail::hashing::
  HashValueImpl<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::SymbolKind>,_1UL>
  ::apply(&seed,&local_80);
  auVar8._8_8_ = 0;
  auVar8._0_8_ = seed;
  hash = SUB168(ZEXT816(0x9e3779b97f4a7c15) * auVar8,8) ^
         SUB168(ZEXT816(0x9e3779b97f4a7c15) * auVar8,0);
  uVar15 = hash >> ((byte)(this->methodMap).table_.
                          super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::tuple<std::basic_string_view<char>,_slang::ast::SymbolKind>,_std::shared_ptr<slang::ast::SystemSubroutine>_>,_slang::hash<std::tuple<std::basic_string_view<char>,_slang::ast::SymbolKind>_>,_std::equal_to<std::tuple<std::basic_string_view<char>,_slang::ast::SymbolKind>_>,_std::allocator<std::pair<const_std::tuple<std::basic_string_view<char>,_slang::ast::SymbolKind>,_std::shared_ptr<slang::ast::SystemSubroutine>_>_>_>
                          .arrays.groups_size_index & 0x3f);
  lVar13 = (hash & 0xff) * 4;
  uVar17 = (&UNK_00461acc)[lVar13];
  uVar18 = (&UNK_00461acd)[lVar13];
  uVar19 = (&UNK_00461ace)[lVar13];
  bVar20 = (&UNK_00461acf)[lVar13];
  uVar14 = (ulong)((uint)hash & 7);
  uVar12 = 0;
  pos0 = uVar15;
  uVar21 = uVar17;
  uVar22 = uVar18;
  uVar23 = uVar19;
  bVar24 = bVar20;
  uVar25 = uVar17;
  uVar26 = uVar18;
  uVar27 = uVar19;
  bVar28 = bVar20;
  uVar29 = uVar17;
  uVar30 = uVar18;
  uVar31 = uVar19;
  bVar32 = bVar20;
  do {
    pgVar4 = (this->methodMap).table_.
             super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::tuple<std::basic_string_view<char>,_slang::ast::SymbolKind>,_std::shared_ptr<slang::ast::SystemSubroutine>_>,_slang::hash<std::tuple<std::basic_string_view<char>,_slang::ast::SymbolKind>_>,_std::equal_to<std::tuple<std::basic_string_view<char>,_slang::ast::SymbolKind>_>,_std::allocator<std::pair<const_std::tuple<std::basic_string_view<char>,_slang::ast::SymbolKind>,_std::shared_ptr<slang::ast::SystemSubroutine>_>_>_>
             .arrays.groups_;
    pgVar2 = pgVar4 + uVar15;
    local_58 = pgVar2->m[0].n;
    uStack_57 = pgVar2->m[1].n;
    uStack_56 = pgVar2->m[2].n;
    bStack_55 = pgVar2->m[3].n;
    uStack_54 = pgVar2->m[4].n;
    uStack_53 = pgVar2->m[5].n;
    uStack_52 = pgVar2->m[6].n;
    bStack_51 = pgVar2->m[7].n;
    uStack_50 = pgVar2->m[8].n;
    uStack_4f = pgVar2->m[9].n;
    uStack_4e = pgVar2->m[10].n;
    bStack_4d = pgVar2->m[0xb].n;
    uStack_4c = pgVar2->m[0xc].n;
    uStack_4b = pgVar2->m[0xd].n;
    uStack_4a = pgVar2->m[0xe].n;
    bVar10 = pgVar2->m[0xf].n;
    auVar16[0] = -(local_58 == uVar17);
    auVar16[1] = -(uStack_57 == uVar18);
    auVar16[2] = -(uStack_56 == uVar19);
    auVar16[3] = -(bStack_55 == bVar20);
    auVar16[4] = -(uStack_54 == uVar21);
    auVar16[5] = -(uStack_53 == uVar22);
    auVar16[6] = -(uStack_52 == uVar23);
    auVar16[7] = -(bStack_51 == bVar24);
    auVar16[8] = -(uStack_50 == uVar25);
    auVar16[9] = -(uStack_4f == uVar26);
    auVar16[10] = -(uStack_4e == uVar27);
    auVar16[0xb] = -(bStack_4d == bVar28);
    auVar16[0xc] = -(uStack_4c == uVar29);
    auVar16[0xd] = -(uStack_4b == uVar30);
    auVar16[0xe] = -(uStack_4a == uVar31);
    auVar16[0xf] = -(bVar10 == bVar32);
    uVar11 = (uint)(ushort)((ushort)(SUB161(auVar16 >> 7,0) & 1) |
                            (ushort)(SUB161(auVar16 >> 0xf,0) & 1) << 1 |
                            (ushort)(SUB161(auVar16 >> 0x17,0) & 1) << 2 |
                            (ushort)(SUB161(auVar16 >> 0x1f,0) & 1) << 3 |
                            (ushort)(SUB161(auVar16 >> 0x27,0) & 1) << 4 |
                            (ushort)(SUB161(auVar16 >> 0x2f,0) & 1) << 5 |
                            (ushort)(SUB161(auVar16 >> 0x37,0) & 1) << 6 |
                            (ushort)(SUB161(auVar16 >> 0x3f,0) & 1) << 7 |
                            (ushort)(SUB161(auVar16 >> 0x47,0) & 1) << 8 |
                            (ushort)(SUB161(auVar16 >> 0x4f,0) & 1) << 9 |
                            (ushort)(SUB161(auVar16 >> 0x57,0) & 1) << 10 |
                            (ushort)(SUB161(auVar16 >> 0x5f,0) & 1) << 0xb |
                            (ushort)(SUB161(auVar16 >> 0x67,0) & 1) << 0xc |
                            (ushort)(SUB161(auVar16 >> 0x6f,0) & 1) << 0xd |
                           (ushort)(SUB161(auVar16 >> 0x77,0) & 1) << 0xe);
    bStack_49 = bVar10;
    if (uVar11 != 0) {
      ppVar5 = (this->methodMap).table_.
               super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::tuple<std::basic_string_view<char>,_slang::ast::SymbolKind>,_std::shared_ptr<slang::ast::SystemSubroutine>_>,_slang::hash<std::tuple<std::basic_string_view<char>,_slang::ast::SymbolKind>_>,_std::equal_to<std::tuple<std::basic_string_view<char>,_slang::ast::SymbolKind>_>,_std::allocator<std::pair<const_std::tuple<std::basic_string_view<char>,_slang::ast::SymbolKind>,_std::shared_ptr<slang::ast::SystemSubroutine>_>_>_>
               .arrays.elements_;
      local_a0 = pos0;
      local_98 = uVar14;
      local_90 = uVar15;
      local_88 = uVar12;
      local_68 = uVar17;
      uStack_67 = uVar18;
      uStack_66 = uVar19;
      bStack_65 = bVar20;
      uStack_64 = uVar21;
      uStack_63 = uVar22;
      uStack_62 = uVar23;
      bStack_61 = bVar24;
      uStack_60 = uVar25;
      uStack_5f = uVar26;
      uStack_5e = uVar27;
      bStack_5d = bVar28;
      uStack_5c = uVar29;
      uStack_5b = uVar30;
      uStack_5a = uVar31;
      bStack_59 = bVar32;
      do {
        uVar7 = 0;
        if (uVar11 != 0) {
          for (; (uVar11 >> uVar7 & 1) == 0; uVar7 = uVar7 + 1) {
          }
        }
        bVar9 = std::
                __tuple_compare<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::SymbolKind>,_std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::SymbolKind>,_0UL,_2UL>
                ::__eq(&local_80,&ppVar5[uVar15 * 0xf + (ulong)uVar7].first);
        if (bVar9) {
          return;
        }
        uVar11 = uVar11 - 1 & uVar11;
      } while (uVar11 != 0);
      bVar10 = pgVar4[uVar15].m[0xf].n;
      uVar12 = local_88;
      uVar15 = local_90;
      uVar14 = local_98;
      pos0 = local_a0;
      uVar17 = local_68;
      uVar18 = uStack_67;
      uVar19 = uStack_66;
      bVar20 = bStack_65;
      uVar21 = uStack_64;
      uVar22 = uStack_63;
      uVar23 = uStack_62;
      bVar24 = bStack_61;
      uVar25 = uStack_60;
      uVar26 = uStack_5f;
      uVar27 = uStack_5e;
      bVar28 = bStack_5d;
      uVar29 = uStack_5c;
      uVar30 = uStack_5b;
      uVar31 = uStack_5a;
      bVar32 = bStack_59;
    }
    if (((&boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>::
           is_not_overflowed(unsigned_long)::shift)[uVar14] & bVar10) == 0) break;
    uVar6 = (this->methodMap).table_.
            super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::tuple<std::basic_string_view<char>,_slang::ast::SymbolKind>,_std::shared_ptr<slang::ast::SystemSubroutine>_>,_slang::hash<std::tuple<std::basic_string_view<char>,_slang::ast::SymbolKind>_>,_std::equal_to<std::tuple<std::basic_string_view<char>,_slang::ast::SymbolKind>_>,_std::allocator<std::pair<const_std::tuple<std::basic_string_view<char>,_slang::ast::SymbolKind>,_std::shared_ptr<slang::ast::SystemSubroutine>_>_>_>
            .arrays.groups_size_mask;
    lVar13 = uVar15 + uVar12;
    uVar12 = uVar12 + 1;
    uVar15 = lVar13 + 1U & uVar6;
  } while (uVar12 <= uVar6);
  if ((this->methodMap).table_.
      super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::tuple<std::basic_string_view<char>,_slang::ast::SymbolKind>,_std::shared_ptr<slang::ast::SystemSubroutine>_>,_slang::hash<std::tuple<std::basic_string_view<char>,_slang::ast::SymbolKind>_>,_std::equal_to<std::tuple<std::basic_string_view<char>,_slang::ast::SymbolKind>_>,_std::allocator<std::pair<const_std::tuple<std::basic_string_view<char>,_slang::ast::SymbolKind>,_std::shared_ptr<slang::ast::SystemSubroutine>_>_>_>
      .size_ctrl.size <
      (this->methodMap).table_.
      super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::tuple<std::basic_string_view<char>,_slang::ast::SymbolKind>,_std::shared_ptr<slang::ast::SystemSubroutine>_>,_slang::hash<std::tuple<std::basic_string_view<char>,_slang::ast::SymbolKind>_>,_std::equal_to<std::tuple<std::basic_string_view<char>,_slang::ast::SymbolKind>_>,_std::allocator<std::pair<const_std::tuple<std::basic_string_view<char>,_slang::ast::SymbolKind>,_std::shared_ptr<slang::ast::SystemSubroutine>_>_>_>
      .size_ctrl.ml) {
    boost::unordered::detail::foa::
    table_core<boost::unordered::detail::foa::flat_map_types<std::tuple<std::basic_string_view<char,std::char_traits<char>>,slang::ast::SymbolKind>,std::shared_ptr<slang::ast::SystemSubroutine>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::tuple<std::basic_string_view<char,std::char_traits<char>>,slang::ast::SymbolKind>,void>,std::equal_to<std::tuple<std::basic_string_view<char,std::char_traits<char>>,slang::ast::SymbolKind>>,std::allocator<std::pair<std::tuple<std::basic_string_view<char,std::char_traits<char>>,slang::ast::SymbolKind>const,std::shared_ptr<slang::ast::SystemSubroutine>>>>
    ::
    nosize_unchecked_emplace_at<boost::unordered::detail::foa::try_emplace_args_t,std::tuple<std::basic_string_view<char,std::char_traits<char>>,slang::ast::SymbolKind>,std::shared_ptr<slang::ast::SystemSubroutine>>
              ((locator *)&seed,local_b0,(arrays_type *)local_b0,pos0,hash,&local_b1,&local_80,
               local_a8);
    psVar1 = &(this->methodMap).table_.
              super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::tuple<std::basic_string_view<char>,_slang::ast::SymbolKind>,_std::shared_ptr<slang::ast::SystemSubroutine>_>,_slang::hash<std::tuple<std::basic_string_view<char>,_slang::ast::SymbolKind>_>,_std::equal_to<std::tuple<std::basic_string_view<char>,_slang::ast::SymbolKind>_>,_std::allocator<std::pair<const_std::tuple<std::basic_string_view<char>,_slang::ast::SymbolKind>,_std::shared_ptr<slang::ast::SystemSubroutine>_>_>_>
              .size_ctrl.size;
    *psVar1 = *psVar1 + 1;
  }
  else {
    boost::unordered::detail::foa::
    table_core<boost::unordered::detail::foa::flat_map_types<std::tuple<std::basic_string_view<char,std::char_traits<char>>,slang::ast::SymbolKind>,std::shared_ptr<slang::ast::SystemSubroutine>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::tuple<std::basic_string_view<char,std::char_traits<char>>,slang::ast::SymbolKind>,void>,std::equal_to<std::tuple<std::basic_string_view<char,std::char_traits<char>>,slang::ast::SymbolKind>>,std::allocator<std::pair<std::tuple<std::basic_string_view<char,std::char_traits<char>>,slang::ast::SymbolKind>const,std::shared_ptr<slang::ast::SystemSubroutine>>>>
    ::
    unchecked_emplace_with_rehash<boost::unordered::detail::foa::try_emplace_args_t,std::tuple<std::basic_string_view<char,std::char_traits<char>>,slang::ast::SymbolKind>,std::shared_ptr<slang::ast::SystemSubroutine>>
              ((locator *)&seed,local_b0,hash,&local_b1,&local_80,local_a8);
  }
  return;
}

Assistant:

void addSystemMethod(SymbolKind typeKind, std::shared_ptr<SystemSubroutine> method) {
        methodMap.emplace(std::make_tuple(std::string_view(method->name), typeKind),
                          std::move(method));
    }